

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

int ndiSerialWrite(int serial_port,char *text,int n)

{
  ssize_t sVar1;
  int *piVar2;
  int local_24;
  int local_20;
  int m;
  int i;
  int n_local;
  char *text_local;
  int serial_port_local;
  
  local_20 = 0;
  m = n;
  do {
    if (m < 1) {
      return local_20;
    }
    sVar1 = write(serial_port,text + local_20,(long)m);
    local_24 = (int)sVar1;
    if (local_24 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) {
        return -1;
      }
      local_24 = 0;
    }
    m = m - local_24;
    local_20 = local_24 + local_20;
  } while( true );
}

Assistant:

ndicapiExport int ndiSerialWrite(int serial_port, const char* text, int n)
{
  int i = 0;
  int m;

  while (n > 0)
  {
    if ((m = write(serial_port, &text[i], n)) == -1)
    {
      if (errno == EAGAIN)   /* system canceled us, retry */
      {
        m = 0;
      }
      else
      {
        return -1;  /* IO error occurred */
      }
    }

    n -= m;  /* n is number of chars left to write */
    i += m;  /* i is the number of chars written */
  }

  return i;  /* return the number of characters written */
}